

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

uint read_chr(lexer *lexer)

{
  uint chr;
  lexer *lexer_local;
  
  if (lexer->file == (FILE *)0x0) {
    lexer_local._4_4_ = 0xc9;
  }
  else if (lexer->last_chr == 0xd1) {
    lexer_local._4_4_ = fgetc((FILE *)lexer->file);
    if (lexer_local._4_4_ == 0xffffffff) {
      fclose((FILE *)lexer->file);
      lexer->file = (FILE *)0x0;
      lexer_local._4_4_ = 0xc9;
    }
    else {
      lexer->col_pos = lexer->col_pos + 1;
    }
  }
  else {
    lexer_local._4_4_ = lexer->last_chr;
    lexer->last_chr = 0xd1;
  }
  return lexer_local._4_4_;
}

Assistant:

uint read_chr(struct lexer *lexer) {
    if (lexer->file == NULL) return END;
    uint chr;
    if (lexer->last_chr != EMPTY) {
        chr = lexer->last_chr;
        lexer->last_chr = EMPTY;
        return chr;
    }
    if ((chr = fgetc(lexer->file)) == EOF) {
        fclose(lexer->file); // 关流
        lexer->file = NULL;
        return END;
    }
    lexer->col_pos++;
    return chr;
}